

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

CryptoUtil * __thiscall
cfd::core::CryptoUtil::EncodeBase64_abi_cxx11_(CryptoUtil *this,ByteData *data)

{
  size_type sVar1;
  ulong uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  ulong local_60;
  size_t i;
  string cdst;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> src;
  ByteData *data_local;
  string *dst;
  
  src.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)data;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,data);
  ::std::__cxx11::string::string((string *)this);
  ::std::__cxx11::string::string((string *)&i);
  for (local_60 = 0;
      sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30),
      local_60 < sVar1; local_60 = local_60 + 1) {
    uVar2 = local_60 % 3;
    if (uVar2 == 0) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,local_60);
      ::std::__cxx11::string::operator[](0xa1a6f0);
      ::std::__cxx11::string::push_back((char)&i);
      sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      if (local_60 + 1 == sVar1) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,local_60);
        ::std::__cxx11::string::operator[](0xa1a6f0);
        ::std::__cxx11::string::push_back((char)&i);
        ::std::__cxx11::string::push_back((char)&i);
        ::std::__cxx11::string::push_back((char)&i);
      }
    }
    else if (uVar2 == 1) {
      in_stack_ffffffffffffff50 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                (in_stack_ffffffffffffff50,local_60 - 1);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                (in_stack_ffffffffffffff50,local_60);
      ::std::__cxx11::string::operator[](0xa1a6f0);
      ::std::__cxx11::string::push_back((char)&i);
      sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      if (local_60 + 1 == sVar1) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,local_60);
        ::std::__cxx11::string::operator[](0xa1a6f0);
        ::std::__cxx11::string::push_back((char)&i);
        ::std::__cxx11::string::push_back((char)&i);
      }
    }
    else if (uVar2 == 2) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,local_60 - 1);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,local_60);
      ::std::__cxx11::string::operator[](0xa1a6f0);
      ::std::__cxx11::string::push_back((char)&i);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,local_60);
      ::std::__cxx11::string::operator[](0xa1a6f0);
      ::std::__cxx11::string::push_back((char)&i);
    }
  }
  ::std::__cxx11::string::swap((string *)this);
  ::std::__cxx11::string::~string((string *)&i);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff50);
  return this;
}

Assistant:

std::string CryptoUtil::EncodeBase64(const ByteData &data) {
  std::vector<uint8_t> src(data.GetBytes());
  std::string dst;
  std::string cdst;

  for (std::size_t i = 0; i < src.size(); ++i) {
    switch (i % 3) {
      case 0:
        cdst.push_back(kBase64EncodeTable[(src[i] & 0xFC) >> 2]);
        if (i + 1 == src.size()) {
          cdst.push_back(kBase64EncodeTable[(src[i] & 0x03) << 4]);
          cdst.push_back('=');
          cdst.push_back('=');
        }

        break;
      case 1:
        cdst.push_back(
            kBase64EncodeTable
                [((src[i - 1] & 0x03) << 4) | ((src[i + 0] & 0xF0) >> 4)]);
        if (i + 1 == src.size()) {
          cdst.push_back(kBase64EncodeTable[(src[i] & 0x0F) << 2]);
          cdst.push_back('=');
        }

        break;
      case 2:
        cdst.push_back(
            kBase64EncodeTable
                [((src[i - 1] & 0x0F) << 2) | ((src[i + 0] & 0xC0) >> 6)]);
        cdst.push_back(kBase64EncodeTable[src[i] & 0x3F]);

        break;
    }
  }

  dst.swap(cdst);
  return dst;
}